

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.cpp
# Opt level: O0

Expression * __thiscall
wasm::TranslateToFuzzReader::makeThrow(TranslateToFuzzReader *this,Type type)

{
  pointer *this_00;
  Module *module;
  bool bVar1;
  value_type *this_01;
  uintptr_t *puVar2;
  Throw *pTVar3;
  Iterator IVar4;
  ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator> PVar5;
  Name name;
  Name NVar6;
  Expression *local_f0;
  uintptr_t local_e8;
  Type t;
  Iterator __end1;
  Iterator __begin1;
  Type *__range1;
  vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> operands;
  Type tagType;
  Type local_78;
  Type local_70;
  Signature local_68;
  HeapType local_58;
  string_view local_50;
  string_view local_40;
  unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_> local_30;
  unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_> newTag;
  Tag *tag;
  TranslateToFuzzReader *local_18;
  TranslateToFuzzReader *this_local;
  Type type_local;
  
  tag._4_4_ = 1;
  local_18 = this;
  this_local = (TranslateToFuzzReader *)type.id;
  bVar1 = Type::operator==((Type *)&this_local,(BasicType *)((long)&tag + 4));
  if (bVar1) {
    if (this->trivialNesting == 0) {
      bVar1 = std::
              vector<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>,_std::allocator<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>_>_>
              ::empty(&this->wasm->tags);
      if (bVar1) {
        addTag(this);
      }
      this_01 = pick<std::vector<std::unique_ptr<wasm::Tag,std::default_delete<wasm::Tag>>,std::allocator<std::unique_ptr<wasm::Tag,std::default_delete<wasm::Tag>>>>>
                          (this,&this->wasm->tags);
      newTag._M_t.super___uniq_ptr_impl<wasm::Tag,_std::default_delete<wasm::Tag>_>._M_t.
      super__Tuple_impl<0UL,_wasm::Tag_*,_std::default_delete<wasm::Tag>_>.
      super__Head_base<0UL,_wasm::Tag_*,_false>._M_head_impl =
           (__uniq_ptr_data<wasm::Tag,_std::default_delete<wasm::Tag>,_true,_true>)
           std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>::get(this_01);
    }
    else {
      bVar1 = IString::operator_cast_to_bool(&(this->trivialTag).super_IString);
      if (bVar1) {
        NVar6.super_IString.str._M_str = (char *)(this->trivialTag).super_IString.str._M_len;
        NVar6.super_IString.str._M_len = (size_t)this->wasm;
        newTag._M_t.super___uniq_ptr_impl<wasm::Tag,_std::default_delete<wasm::Tag>_>._M_t.
        super__Tuple_impl<0UL,_wasm::Tag_*,_std::default_delete<wasm::Tag>_>.
        super__Head_base<0UL,_wasm::Tag_*,_false>._M_head_impl =
             (__uniq_ptr_data<wasm::Tag,_std::default_delete<wasm::Tag>,_true,_true>)
             wasm::Module::getTag(NVar6);
      }
      else {
        module = this->wasm;
        Name::Name((Name *)&local_50,"tag$");
        local_40 = (string_view)Names::getValidTagName(module,(Name)local_50);
        Type::Type(&local_70,none);
        Type::Type(&local_78,none);
        Signature::Signature(&local_68,local_70,local_78);
        wasm::HeapType::HeapType(&local_58,local_68);
        name.super_IString.str._M_str = (char *)local_40._M_len;
        name.super_IString.str._M_len = (size_t)&local_30;
        Builder::makeTag(name,(HeapType)local_40._M_str);
        newTag._M_t.super___uniq_ptr_impl<wasm::Tag,_std::default_delete<wasm::Tag>_>._M_t.
        super__Tuple_impl<0UL,_wasm::Tag_*,_std::default_delete<wasm::Tag>_>.
        super__Head_base<0UL,_wasm::Tag_*,_false>._M_head_impl =
             (__uniq_ptr_data<wasm::Tag,_std::default_delete<wasm::Tag>,_true,_true>)
             wasm::Module::addTag((unique_ptr *)this->wasm);
        Name::operator=(&this->trivialTag,
                        (Name *)newTag._M_t.
                                super___uniq_ptr_impl<wasm::Tag,_std::default_delete<wasm::Tag>_>.
                                _M_t.
                                super__Tuple_impl<0UL,_wasm::Tag_*,_std::default_delete<wasm::Tag>_>
                                .super__Head_base<0UL,_wasm::Tag_*,_false>._M_head_impl);
        std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>::~unique_ptr(&local_30);
      }
    }
    operands.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         (pointer)Tag::params((Tag *)newTag._M_t.
                                     super___uniq_ptr_impl<wasm::Tag,_std::default_delete<wasm::Tag>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_wasm::Tag_*,_std::default_delete<wasm::Tag>_>
                                     .super__Head_base<0UL,_wasm::Tag_*,_false>._M_head_impl);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::vector
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)&__range1);
    this_00 = &operands.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
               _M_impl.super__Vector_impl_data._M_end_of_storage;
    IVar4 = Type::begin((Type *)this_00);
    __end1.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index =
         (size_t)IVar4.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent;
    PVar5 = (ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>)
            Type::end((Type *)this_00);
    while( true ) {
      __end1.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent =
           (Type *)PVar5.index;
      t.id = (uintptr_t)PVar5.parent;
      bVar1 = ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>::operator!=
                        ((ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator> *)
                         &__end1.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>
                          .index,(ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator> *)&t
                        );
      if (!bVar1) break;
      puVar2 = (uintptr_t *)
               wasm::Type::Iterator::operator*
                         ((Iterator *)
                          &__end1.
                           super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index
                         );
      local_e8 = *puVar2;
      local_f0 = make(this,(Type)local_e8);
      std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
                ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)&__range1,
                 &local_f0);
      ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>::operator++
                ((ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator> *)
                 &__end1.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index);
      PVar5.index = (size_t)__end1.
                            super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.
                            parent;
      PVar5.parent = (Type *)t.id;
    }
    pTVar3 = Builder::makeThrow(&this->builder,
                                (Tag *)newTag._M_t.
                                       super___uniq_ptr_impl<wasm::Tag,_std::default_delete<wasm::Tag>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_wasm::Tag_*,_std::default_delete<wasm::Tag>_>
                                       .super__Head_base<0UL,_wasm::Tag_*,_false>._M_head_impl,
                                (vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
                                &__range1);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::~vector
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)&__range1);
    return (Expression *)pTVar3;
  }
  __assert_fail("type == Type::unreachable",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/fuzzing/fuzzing.cpp"
                ,0x1438,"Expression *wasm::TranslateToFuzzReader::makeThrow(Type)");
}

Assistant:

Expression* TranslateToFuzzReader::makeThrow(Type type) {
  assert(type == Type::unreachable);
  Tag* tag;
  if (trivialNesting) {
    // We are nested under a makeTrivial call, so only emit something trivial.
    // Get (or create) a trivial tag, so we have no operands (and will not call
    // make(), below). Otherwise, we might recurse very deeply if we threw a
    // tag that contains an exnref (for which we may end up creating yet another
    // throw in a try).
    if (!trivialTag) {
      auto newTag = builder.makeTag(Names::getValidTagName(wasm, "tag$"),
                                    Signature(Type::none, Type::none));
      tag = wasm.addTag(std::move(newTag));
      trivialTag = tag->name;
    } else {
      tag = wasm.getTag(trivialTag);
    }
  } else {
    // Get a random tag, adding a random one if necessary.
    if (wasm.tags.empty()) {
      addTag();
    }
    tag = pick(wasm.tags).get();
  }
  auto tagType = tag->params();
  std::vector<Expression*> operands;
  for (auto t : tagType) {
    operands.push_back(make(t));
  }
  return builder.makeThrow(tag, operands);
}